

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<const_Catch::IConfig> * __thiscall
Catch::Ptr<const_Catch::IConfig>::operator=
          (Ptr<const_Catch::IConfig> *this,Ptr<const_Catch::IConfig> *other)

{
  Ptr<const_Catch::IConfig> *in_RDI;
  Ptr<const_Catch::IConfig> temp;
  Ptr<const_Catch::IConfig> *this_00;
  Ptr<const_Catch::IConfig> local_18 [3];
  
  this_00 = local_18;
  Ptr(this_00,in_RDI);
  swap(this_00,in_RDI);
  ~Ptr(this_00);
  return in_RDI;
}

Assistant:

Ptr& operator = ( Ptr const& other ){
            Ptr temp( other );
            swap( temp );
            return *this;
        }